

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O2

int Raig_ManSimulateRound(Raig_Man_t *p,int fMiter,int fFirst,int *piPat)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int local_50;
  
  for (iVar11 = 0; iVar11 < p->vCis2Ids->nSize; iVar11 = iVar11 + 1) {
    iVar1 = Vec_IntEntry(p->vCis2Ids,iVar11);
    if (p->nPis <= iVar1) {
      iVar2 = Vec_IntEntry(p->vLos,iVar1 - p->nPis);
      puVar3 = Raig_ManSimRef(p,iVar2);
      if (fFirst == 0) {
        iVar2 = Vec_IntEntry(p->vLis,iVar1 - p->nPis);
        puVar4 = Raig_ManSimDeref(p,iVar2);
        for (lVar9 = 1; lVar9 <= p->nWords; lVar9 = lVar9 + 1) {
          puVar3[lVar9] = puVar4[lVar9];
        }
      }
      else {
        memset(puVar3 + 1,0,(long)p->nWords << 2);
      }
      if (*puVar3 == 0) {
        *puVar3 = 1;
        iVar1 = Vec_IntEntry(p->vLos,iVar1 - p->nPis);
        Raig_ManSimDeref(p,iVar1);
      }
    }
  }
  uVar12 = 2;
  lVar9 = 1;
  iVar11 = 0;
  local_50 = 0;
  do {
    if ((long)p->nObjs <= (long)uVar12) {
      if (iVar11 != p->nCis) {
        __assert_fail("nCis == p->nCis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                      ,399,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
      }
      if (local_50 != p->nCos) {
        __assert_fail("nCos == p->nCos",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                      ,400,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
      }
      uVar12 = 0;
      if (p->nMems != p->vLis->nSize + 1) {
        __assert_fail("p->nMems == 1 + Vec_IntSize(p->vLis)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                      ,0x191,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
      }
LAB_0054cc37:
      return (int)uVar12;
    }
    iVar1 = (int)uVar12;
    if (p->pFans0[uVar12] == 0) {
      iVar2 = Vec_IntEntry(p->vCis2Ids,iVar11);
      if (iVar2 < p->nPis) {
        puVar3 = Raig_ManSimRef(p,iVar1);
        for (lVar6 = lVar9; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
          uVar10 = Aig_ManRandom(0);
          puVar3[lVar6] = uVar10;
        }
        if (*puVar3 == 0) {
          *puVar3 = 1;
          Raig_ManSimDeref(p,iVar1);
        }
      }
      else {
        uVar10 = Vec_IntEntry(p->vLos,iVar2 - p->nPis);
        if (uVar12 != uVar10) {
          __assert_fail("Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x15d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
      }
      iVar11 = iVar11 + 1;
    }
    else if (p->pFans1[uVar12] == 0) {
      puVar3 = Raig_ManSimDeref(p,p->pFans0[uVar12] >> 1);
      if ((fMiter == 0) || (p->nPos <= local_50)) {
        puVar4 = Raig_ManSimRef(p,iVar1);
        if (*puVar4 != 1) {
          __assert_fail("pRes[0] == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x171,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
        lVar6 = lVar9;
        if ((*(byte *)(p->pFans0 + uVar12) & 1) == 0) {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar4[lVar6] = puVar3[lVar6];
          }
        }
        else {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar4[lVar6] = ~puVar3[lVar6];
          }
        }
      }
      else {
        uVar7 = -(p->pFans0[uVar12] & 1U);
        uVar10 = p->nWords;
        if (p->nWords < 1) {
          uVar10 = 0;
        }
        for (lVar6 = 0; puVar3 = puVar3 + 1, (ulong)uVar10 * 0x20 + lVar6 != 0;
            lVar6 = lVar6 + -0x20) {
          if (*puVar3 != uVar7) {
            for (uVar10 = 0;
                (uVar8 = 0xffffffff, uVar10 != 0x20 &&
                (uVar8 = uVar10, ((*puVar3 ^ uVar7) >> (uVar10 & 0x1f) & 1) == 0));
                uVar10 = uVar10 + 1) {
            }
            *piPat = uVar8 - (int)lVar6;
            goto LAB_0054cc37;
          }
        }
      }
      local_50 = local_50 + 1;
    }
    else {
      puVar3 = Raig_ManSimRef(p,iVar1);
      if (*puVar3 == 0) {
        __assert_fail("pRes[0] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                      ,0x17d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
      }
      uVar10 = p->pFans0[uVar12];
      uVar7 = p->pFans1[uVar12];
      puVar4 = Raig_ManSimDeref(p,(int)uVar10 >> 1);
      puVar5 = Raig_ManSimDeref(p,p->pFans1[uVar12] >> 1);
      if ((uVar10 & 1) == 0) {
        lVar6 = lVar9;
        if ((uVar7 & 1) == 0) {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar3[lVar6] = puVar5[lVar6] & puVar4[lVar6];
          }
        }
        else {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar3[lVar6] = ~puVar5[lVar6] & puVar4[lVar6];
          }
        }
      }
      else {
        lVar6 = lVar9;
        if ((uVar7 & 1) == 0) {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar3[lVar6] = ~puVar4[lVar6] & puVar5[lVar6];
          }
        }
        else {
          for (; lVar6 <= p->nWords; lVar6 = lVar6 + 1) {
            puVar3[lVar6] = ~(puVar5[lVar6] | puVar4[lVar6]);
          }
        }
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

int Raig_ManSimulateRound( Raig_Man_t * p, int fMiter, int fFirst, int * piPat )
{ 
    unsigned * pRes0, * pRes1, * pRes;
    int i, w, nCis, nCos, iFan0, iFan1, iPioNum;
    // nove the values to the register outputs
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < p->nPis )
            continue;
        pRes = Raig_ManSimRef( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        if ( fFirst )
            memset( pRes + 1, 0, sizeof(unsigned) * p->nWords );
        else
        {
            pRes0 = Raig_ManSimDeref( p, Vec_IntEntry(p->vLis, iPioNum-p->nPis) );
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w];
        }
        // handle unused PIs
        if ( pRes[0] == 0 ) 
        {
            pRes[0] = 1;
            Raig_ManSimDeref( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        }
    }
    // simulate the logic
    nCis = nCos = 0;
    for ( i = 2; i < p->nObjs; i++ )
    {
        if ( p->pFans0[i] == 0 ) // ci always has zero first fanin
        {
            iPioNum = Vec_IntEntry( p->vCis2Ids, nCis );
            if ( iPioNum < p->nPis )
            {
                pRes = Raig_ManSimRef( p, i );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Aig_ManRandom( 0 );
                // handle unused PIs
                if ( pRes[0] == 0 ) 
                {
                    pRes[0] = 1;
                    Raig_ManSimDeref( p, i );
                }
            }
            else
                assert( Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i );
            nCis++;
            continue;
        }
        if ( p->pFans1[i] == 0 ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
            if ( nCos < p->nPos && fMiter )
            {
                unsigned Const = Raig_LitIsCompl(p->pFans0[i])? ~0 : 0;
                for ( w = 1; w <= p->nWords; w++ )
                    if ( pRes0[w] != Const )
                    {
                        *piPat = 32*(w-1) + Aig_WordFindFirstBit( pRes0[w] ^ Const );
                        return i;
                    }
            }
            else
            {
                pRes = Raig_ManSimRef( p, i );
                assert( pRes[0] == 1 );
                if ( Raig_LitIsCompl(p->pFans0[i]) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = ~pRes0[w];
                else
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = pRes0[w];
            }
            nCos++;
            continue;
        }
        pRes  = Raig_ManSimRef( p, i );
        assert( pRes[0] > 0 );
        iFan0 = p->pFans0[i];
        iFan1 = p->pFans1[i];
        pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
        pRes1 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans1[i]) );
        if ( Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~(pRes0[w] | pRes1[w]);
        else if ( Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~pRes0[w] & pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & ~pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & pRes1[w];
    }
    assert( nCis == p->nCis );
    assert( nCos == p->nCos );
    assert( p->nMems == 1 + Vec_IntSize(p->vLis) );
    return 0;
}